

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O0

void __thiscall cmCursesMainForm::UpdateStatusBar(cmCursesMainForm *this,char *message)

{
  size_t sVar1;
  int iVar2;
  FIELD *field;
  cmState *pcVar3;
  char *pcVar4;
  unsigned_long *puVar5;
  int local_694;
  int local_684;
  int local_678;
  int local_674;
  undefined2 local_663;
  undefined1 local_661;
  size_t sStack_660;
  char fmt_s [3];
  size_t sideSpace;
  char vertmp [128];
  char version [512];
  unsigned_long local_3d0;
  unsigned_long local_3c8;
  size_t local_3c0;
  size_t width;
  size_t helpLen;
  size_t curFieldLen;
  char bar [512];
  string local_1a0;
  allocator<char> local_179;
  string local_178;
  char *local_158;
  char *hs;
  allocator<char> local_139;
  string local_138;
  char *local_118;
  char *existingValue;
  char *curField;
  char help [128];
  long *local_80;
  cmCursesWidget *lbl;
  int findex;
  FIELD *cur;
  char fmt [59];
  int y;
  int x;
  char *message_local;
  cmCursesMainForm *this_local;
  
  if (_stdscr == 0) {
    local_674 = -1;
    local_678 = -1;
  }
  else {
    local_674 = *(short *)(_stdscr + 4) + 1;
    local_678 = *(short *)(_stdscr + 6) + 1;
  }
  if (((local_678 < 0x41) || (local_678 < this->InitialWidth)) || (local_674 < 6)) {
    curses_clear();
    curses_move(0,0);
    memcpy(&cur,"Window is too small. A size of at least %dx%d is required.",0x3b);
    if (this->InitialWidth < 0x42) {
      local_684 = 0x41;
    }
    else {
      local_684 = this->InitialWidth;
    }
    printw(&cur,local_684,6);
    if (_stdscr == 0) {
      local_694 = -1;
    }
    else {
      local_694 = *(short *)(_stdscr + 4) + 1;
    }
    wtouchln(_stdscr,0,local_694,1);
    wrefresh(_stdscr);
  }
  else {
    field = current_field((this->super_cmCursesForm).Form);
    iVar2 = field_index(field);
    local_80 = (long *)0x0;
    if (-1 < iVar2) {
      local_80 = (long *)field_userptr(this->Fields[iVar2 + -2]);
    }
    memset(&curField,0,0x80);
    existingValue = "";
    if (local_80 != (long *)0x0) {
      existingValue = (char *)(**(code **)(*local_80 + 0x28))();
      pcVar3 = cmake::GetState(this->CMakeInstance);
      pcVar4 = existingValue;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,pcVar4,&local_139);
      pcVar4 = cmState::GetCacheEntryValue(pcVar3,&local_138);
      std::__cxx11::string::~string((string *)&local_138);
      std::allocator<char>::~allocator(&local_139);
      local_118 = pcVar4;
      if (pcVar4 == (char *)0x0) {
        sprintf((char *)&curField," ");
      }
      else {
        pcVar3 = cmake::GetState(this->CMakeInstance);
        pcVar4 = existingValue;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,pcVar4,&local_179);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1a0,"HELPSTRING",(allocator<char> *)(bar + 0x1ff));
        pcVar4 = cmState::GetCacheEntryProperty(pcVar3,&local_178,&local_1a0);
        std::__cxx11::string::~string((string *)&local_1a0);
        std::allocator<char>::~allocator((allocator<char> *)(bar + 0x1ff));
        std::__cxx11::string::~string((string *)&local_178);
        std::allocator<char>::~allocator(&local_179);
        local_158 = pcVar4;
        if (pcVar4 == (char *)0x0) {
          curField._0_1_ = 0;
        }
        else {
          strncpy((char *)&curField,pcVar4,0x7f);
          help[0x77] = '\0';
        }
      }
    }
    helpLen = strlen(existingValue);
    width = strlen((char *)&curField);
    local_3c8 = (unsigned_long)local_678;
    local_3d0 = 0x200;
    puVar5 = std::min<unsigned_long>(&local_3c8,&local_3d0);
    local_3c0 = *puVar5;
    if (message == (char *)0x0) {
      strncpy((char *)&curFieldLen,existingValue,local_3c0);
      if (helpLen < local_3c0) {
        bar[helpLen - 8] = ':';
        bar[helpLen - 7] = ' ';
        strncpy(bar + (helpLen - 6),(char *)&curField,(local_3c0 - helpLen) - 2);
        if (helpLen + width + 2 < local_3c0) {
          memset(bar + width + helpLen + -6,0x20,local_3c0 - (helpLen + width + 2));
        }
      }
    }
    else {
      existingValue = message;
      helpLen = strlen(message);
      strncpy((char *)&curFieldLen,existingValue,local_3c0);
      if (helpLen < local_3c0) {
        memset(bar + (helpLen - 8),0x20,local_3c0 - helpLen);
      }
    }
    bar[local_3c0 - 8] = '\0';
    pcVar4 = cmVersion::GetCMakeVersion();
    sprintf((char *)&sideSpace,"CMake Version %s",pcVar4);
    sVar1 = local_3c0;
    sStack_660 = strlen((char *)&sideSpace);
    sStack_660 = sVar1 - sStack_660;
    memset(vertmp + 0x78,0x20,sStack_660);
    sprintf(vertmp + sStack_660 + 0x78,"%s",&sideSpace);
    vertmp[local_3c0 + 0x78] = '\0';
    local_663 = 0x7325;
    local_661 = 0;
    curses_move(local_674 - 5,0);
    wattr_on(_stdscr,0x10000,0);
    printw(&local_663,&curFieldLen);
    wattr_off(_stdscr,0x10000,0);
    curses_move(local_674 - 4,0);
    printw(&local_663,vertmp + 0x78);
    pos_form_cursor((this->super_cmCursesForm).Form);
  }
  return;
}

Assistant:

void cmCursesMainForm::UpdateStatusBar(const char* message)
{
  int x, y;
  getmaxyx(stdscr, y, x);
  // If window size is too small, display error and return
  if (x < cmCursesMainForm::MIN_WIDTH || x < this->InitialWidth ||
      y < cmCursesMainForm::MIN_HEIGHT) {
    curses_clear();
    curses_move(0, 0);
    char fmt[] = "Window is too small. A size of at least %dx%d is required.";
    printw(fmt,
           (cmCursesMainForm::MIN_WIDTH < this->InitialWidth
              ? this->InitialWidth
              : cmCursesMainForm::MIN_WIDTH),
           cmCursesMainForm::MIN_HEIGHT);
    touchwin(stdscr);
    wrefresh(stdscr);
    return;
  }

  // Get the key of the current entry
  FIELD* cur = current_field(this->Form);
  int findex = field_index(cur);
  cmCursesWidget* lbl = nullptr;
  if (findex >= 0) {
    lbl = reinterpret_cast<cmCursesWidget*>(
      field_userptr(this->Fields[findex - 2]));
  }
  char help[128] = "";
  const char* curField = "";
  if (lbl) {
    curField = lbl->GetValue();

    // Get the help string of the current entry
    // and add it to the help string
    const char* existingValue =
      this->CMakeInstance->GetState()->GetCacheEntryValue(curField);
    if (existingValue) {
      const char* hs = this->CMakeInstance->GetState()->GetCacheEntryProperty(
        curField, "HELPSTRING");
      if (hs) {
        strncpy(help, hs, 127);
        help[127] = '\0';
      } else {
        help[0] = 0;
      }
    } else {
      sprintf(help, " ");
    }
  }

  // Join the key, help string and pad with spaces
  // (or truncate) as necessary
  char bar[cmCursesMainForm::MAX_WIDTH];
  size_t curFieldLen = strlen(curField);
  size_t helpLen = strlen(help);

  size_t width = std::min<size_t>(x, cmCursesMainForm::MAX_WIDTH);

  if (message) {
    curField = message;
    curFieldLen = strlen(message);
    strncpy(bar, curField, width);
    if (curFieldLen < width) {
      memset(bar + curFieldLen, ' ', width - curFieldLen);
    }
  } else {
    strncpy(bar, curField, width);
    if (curFieldLen < width) {
      bar[curFieldLen] = ':';
      bar[curFieldLen + 1] = ' ';
      strncpy(bar + curFieldLen + 2, help, width - curFieldLen - 2);
      if (curFieldLen + helpLen + 2 < width) {
        memset(bar + curFieldLen + helpLen + 2, ' ',
               width - (curFieldLen + helpLen + 2));
      }
    }
  }

  bar[width] = '\0';

  // Display CMake version info on the next line
  // We want to display this on the right
  char version[cmCursesMainForm::MAX_WIDTH];
  char vertmp[128];
  sprintf(vertmp, "CMake Version %s", cmVersion::GetCMakeVersion());
  size_t sideSpace = (width - strlen(vertmp));
  memset(version, ' ', sideSpace);
  sprintf(version + sideSpace, "%s", vertmp);
  version[width] = '\0';

  // Now print both lines
  char fmt_s[] = "%s";
  curses_move(y - 5, 0);
  attron(A_STANDOUT);
  printw(fmt_s, bar);
  attroff(A_STANDOUT);
  curses_move(y - 4, 0);
  printw(fmt_s, version);
  pos_form_cursor(this->Form);
}